

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_serial_writer_test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  size_t sVar1;
  undefined1 local_60 [8];
  DateTimeData dt;
  RegisterData reg;
  ApplicationXimuWriter writer;
  char **argv_local;
  int argc_local;
  
  ApplicationXimuWriter::ApplicationXimuWriter((ApplicationXimuWriter *)&reg);
  ximu::WriterBase::sendCommandPacket((WriterBase *)&reg,ALGORITHM_CLEAR_TARE);
  ximu::WriterBase::sendCommandPacket((WriterBase *)&reg,ALGORITHM_INITIALISE_THEN_TARE);
  ximu::RegisterData::RegisterData((RegisterData *)&dt._seconds,ACCELEROMETER_BIAS_X,1.0);
  ximu::WriterBase::sendReadRegisterPacket((WriterBase *)&reg,(RegisterData *)&dt._seconds);
  ximu::WriterBase::sendWriteRegisterPacket((WriterBase *)&reg,(RegisterData *)&dt._seconds);
  ximu::WriterBase::sendReadDateTimePacket((WriterBase *)&reg);
  ximu::DateTimeData::DateTimeData((DateTimeData *)local_60);
  ximu::WriterBase::sendWriteDateTimePacket((WriterBase *)&reg,(DateTimeData *)local_60);
  sVar1 = ApplicationXimuWriter::SendCount((ApplicationXimuWriter *)&reg);
  argv_local._4_4_ = (uint)(sVar1 != 6);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[]) {
  ApplicationXimuWriter writer;

  writer.sendCommandPacket(ximu::CommandCodes::ALGORITHM_CLEAR_TARE);
  writer.sendCommandPacket(ximu::CommandCodes::ALGORITHM_INITIALISE_THEN_TARE);

  ximu::RegisterData reg(ximu::reg::ACCELEROMETER_BIAS_X, 1.0f);
  writer.sendReadRegisterPacket(reg);
  writer.sendWriteRegisterPacket(reg);

  writer.sendReadDateTimePacket();
  ximu::DateTimeData dt;
  writer.sendWriteDateTimePacket(dt);

  if (writer.SendCount() != 6)
    return 1;

  return 0;
}